

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O1

void __thiscall
PrintfTest_NumberIsTooBigInArgIndex_Test::TestBody(PrintfTest_NumberIsTooBigInArgIndex_Test *this)

{
  string_view format;
  string_view format_00;
  bool bVar1;
  char *pcVar2;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  AssertHelper local_2f8 [2];
  undefined1 local_2e8 [16];
  AssertionResult local_2d8;
  undefined1 local_2c8 [16];
  string local_2b8 [8];
  size_t local_2b0;
  char local_2a8 [16];
  undefined8 local_298 [2];
  string local_288;
  string local_268;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  undefined1 *local_240;
  long lStack_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  testing::AssertionSuccess();
  if (local_2d8.success_ == true) {
    local_2f8[0].data_ = (AssertHelperData *)local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"number is too big","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_298[0] = 0x80000000;
      lStack_238 = 0;
      local_248.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_00240f40;
      local_230 = 500;
      format_str.size_ = 4;
      format_str.data_ = "%{}$";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_298;
      args.types_ = fmt::v5::
                    format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
                    ::TYPES;
      local_240 = local_228;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_248,format_str,args,(locale_ref)0x0);
      local_2b8 = (string  [8])local_2a8;
      std::__cxx11::string::_M_construct<char_const*>(local_2b8,local_240,local_240 + lStack_238);
      local_248.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_00240f40;
      if (local_240 != local_228) {
        operator_delete(local_240);
      }
      format.size_ = local_2b0;
      format.data_ = (char *)local_2b8;
      test_sprintf<>(&local_268,format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if (local_2b8 != (string  [8])local_2a8) {
        operator_delete((void *)local_2b8);
      }
    }
    testing::AssertionResult::operator<<
              (&local_2d8,
               (char (*) [119])
               "Expected: test_sprintf(format(\"%{}$\", BIG_NUM)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_2f8[0].data_ != (AssertHelperData *)local_2e8) {
      operator_delete(local_2f8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_248);
  if (local_2d8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = *(char **)local_2d8.message_.ptr_;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_2f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
             ,0x56,pcVar2);
  testing::internal::AssertHelper::operator=(local_2f8,(Message *)&local_248);
  testing::internal::AssertHelper::~AssertHelper(local_2f8);
  if (local_248.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_248.ptr_ + 8))();
    }
    local_248.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_2c8[0] == true) {
    local_2f8[0].data_ = (AssertHelperData *)local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"number is too big","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_2d8.success_ = false;
      local_2d8._1_7_ = 0x800000;
      lStack_238 = 0;
      local_248.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_00240f40;
      local_230 = 500;
      format_str_00.size_ = 5;
      format_str_00.data_ = "%{}$d";
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_2d8;
      args_00.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
           ::TYPES;
      local_240 = local_228;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_248,format_str_00,args_00,(locale_ref)0x0);
      local_2b8 = (string  [8])local_2a8;
      std::__cxx11::string::_M_construct<char_const*>(local_2b8,local_240,local_240 + lStack_238);
      local_248.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_00240f40;
      if (local_240 != local_228) {
        operator_delete(local_240);
      }
      format_00.size_ = local_2b0;
      format_00.data_ = (char *)local_2b8;
      test_sprintf<>(&local_288,format_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if (local_2b8 != (string  [8])local_2a8) {
        operator_delete((void *)local_2b8);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)local_2c8,
               (char (*) [120])
               "Expected: test_sprintf(format(\"%{}$d\", BIG_NUM)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_2f8[0].data_ != (AssertHelperData *)local_2e8) {
      operator_delete(local_2f8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_248);
  if ((undefined8 *)local_2c8._8_8_ == (undefined8 *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = *(char **)local_2c8._8_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_2f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
             ,0x58,pcVar2);
  testing::internal::AssertHelper::operator=(local_2f8,(Message *)&local_248);
  testing::internal::AssertHelper::~AssertHelper(local_2f8);
  if (local_248.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_248.ptr_ + 8))();
    }
    local_248.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(PrintfTest, NumberIsTooBigInArgIndex) {
  EXPECT_THROW_MSG(test_sprintf(format("%{}$", BIG_NUM)),
      format_error, "number is too big");
  EXPECT_THROW_MSG(test_sprintf(format("%{}$d", BIG_NUM)),
      format_error, "number is too big");
}